

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

int SUNLinSolInitialize_SPGMR(SUNLinearSolver S)

{
  int *piVar1;
  N_Vector *pp_Var2;
  void *pvVar3;
  SUNLinearSolverContent_SPGMR content;
  int k;
  SUNLinearSolver S_local;
  
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    piVar1 = (int *)S->content;
    if (piVar1[3] < 0) {
      piVar1[3] = 0;
    }
    if (((piVar1[1] != 1) && (piVar1[1] != 2)) && (piVar1[1] != 3)) {
      piVar1[1] = 0;
    }
    if (*(long *)(piVar1 + 0x18) == 0) {
      pp_Var2 = N_VCloneVectorArray(*piVar1 + 1,*(N_Vector *)(piVar1 + 0x22));
      *(N_Vector **)(piVar1 + 0x18) = pp_Var2;
      if (*(long *)(piVar1 + 0x18) == 0) {
        SUNLinSolFree(S);
        piVar1[8] = -3;
        piVar1[9] = -1;
        return -3;
      }
    }
    if (*(long *)(piVar1 + 0x1a) == 0) {
      pvVar3 = malloc((long)(*piVar1 + 1) << 3);
      *(void **)(piVar1 + 0x1a) = pvVar3;
      if (*(long *)(piVar1 + 0x1a) == 0) {
        SUNLinSolFree(S);
        piVar1[8] = -3;
        piVar1[9] = -1;
        return -3;
      }
      for (content._4_4_ = 0; content._4_4_ <= *piVar1; content._4_4_ = content._4_4_ + 1) {
        *(undefined8 *)(*(long *)(piVar1 + 0x1a) + (long)content._4_4_ * 8) = 0;
        pvVar3 = malloc((long)*piVar1 << 3);
        *(void **)(*(long *)(piVar1 + 0x1a) + (long)content._4_4_ * 8) = pvVar3;
        if (*(long *)(*(long *)(piVar1 + 0x1a) + (long)content._4_4_ * 8) == 0) {
          SUNLinSolFree(S);
          piVar1[8] = -3;
          piVar1[9] = -1;
          return -3;
        }
      }
    }
    if (*(long *)(piVar1 + 0x1c) == 0) {
      pvVar3 = malloc((long)(*piVar1 << 1) << 3);
      *(void **)(piVar1 + 0x1c) = pvVar3;
      if (*(long *)(piVar1 + 0x1c) == 0) {
        SUNLinSolFree(S);
        piVar1[8] = -3;
        piVar1[9] = -1;
        return -3;
      }
    }
    if (*(long *)(piVar1 + 0x20) == 0) {
      pvVar3 = malloc((long)(*piVar1 + 1) << 3);
      *(void **)(piVar1 + 0x20) = pvVar3;
      if (*(long *)(piVar1 + 0x20) == 0) {
        SUNLinSolFree(S);
        piVar1[8] = -3;
        piVar1[9] = -1;
        return -3;
      }
    }
    if (*(long *)(piVar1 + 0x24) == 0) {
      pvVar3 = malloc((long)(*piVar1 + 1) << 3);
      *(void **)(piVar1 + 0x24) = pvVar3;
      if (*(long *)(piVar1 + 0x24) == 0) {
        SUNLinSolFree(S);
        piVar1[8] = -3;
        piVar1[9] = -1;
        return -3;
      }
    }
    if (*(long *)(piVar1 + 0x26) == 0) {
      pvVar3 = malloc((long)(*piVar1 + 1) << 3);
      *(void **)(piVar1 + 0x26) = pvVar3;
      if (*(long *)(piVar1 + 0x26) == 0) {
        SUNLinSolFree(S);
        piVar1[8] = -3;
        piVar1[9] = -1;
        return -3;
      }
    }
    piVar1[8] = 0;
    piVar1[9] = 0;
    S_local._4_4_ = 0;
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolInitialize_SPGMR(SUNLinearSolver S)
{
  int k;
  SUNLinearSolverContent_SPGMR content;

  /* set shortcut to SPGMR memory structure */
  if (S == NULL) return(SUNLS_MEM_NULL);  
  content = SPGMR_CONTENT(S);

  /* ensure valid options */
  if (content->max_restarts < 0) 
    content->max_restarts = SUNSPGMR_MAXRS_DEFAULT;
  if ( (content->pretype != PREC_LEFT) && 
       (content->pretype != PREC_RIGHT) && 
       (content->pretype != PREC_BOTH) )
    content->pretype = PREC_NONE;


  /* allocate solver-specific memory (where the size depends on the
     choice of maxl) here */

  /*   Krylov subspace vectors */
  if (content->V == NULL) {
    content->V = N_VCloneVectorArray(content->maxl+1, content->vtemp);
    if (content->V == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }
  
  /*   Hessenberg matrix Hes */
  if (content->Hes == NULL) {
    content->Hes = (realtype **) malloc((content->maxl+1)*sizeof(realtype *)); 
    if (content->Hes == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }

    for (k=0; k<=content->maxl; k++) {
      content->Hes[k] = NULL;
      content->Hes[k] = (realtype *) malloc(content->maxl*sizeof(realtype));
      if (content->Hes[k] == NULL) {
        SUNLinSolFree(S);
        content->last_flag = SUNLS_MEM_FAIL;
        return(SUNLS_MEM_FAIL);
      }
    }
  }
  
  /*   Givens rotation components */
  if (content->givens == NULL) {
    content->givens = (realtype *) malloc(2*content->maxl*sizeof(realtype));
    if (content->givens == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }
  
  /*    y and g vectors */
  if (content->yg == NULL) {
    content->yg = (realtype *) malloc((content->maxl+1)*sizeof(realtype));
    if (content->yg == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    cv vector for fused vector ops */
  if (content->cv == NULL) {
    content->cv = (realtype *) malloc((content->maxl+1)*sizeof(realtype));
    if (content->cv == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /*    Xv vector for fused vector ops */
  if (content->Xv == NULL) {
    content->Xv = (N_Vector *) malloc((content->maxl+1)*sizeof(N_Vector));
    if (content->Xv == NULL) {
      SUNLinSolFree(S);
      content->last_flag = SUNLS_MEM_FAIL;
      return(SUNLS_MEM_FAIL);
    }
  }

  /* return with success */
  content->last_flag = SUNLS_SUCCESS;
  return(SUNLS_SUCCESS);
}